

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_aggregator.cc
# Opt level: O2

void __thiscall
StatAggregator::aggregateAndPrintStats(StatAggregator *this,char *title,int count,char *unit)

{
  stat_history_t *psVar1;
  long lVar2;
  char *pcVar3;
  int j;
  long lVar4;
  long lVar5;
  char *this_00;
  string *this_01;
  StatAggregator *this_02;
  long lVar6;
  allocator local_bd;
  uint local_bc;
  char *local_b8;
  char *local_b0;
  samples_t all_timings;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  local_90;
  string local_78;
  int printed;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  all_timings.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_timings.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_timings.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc = count;
  local_b8 = title;
  local_b0 = unit;
  for (lVar6 = 0; pcVar3 = local_b0, lVar6 < this->num_stats; lVar6 = lVar6 + 1) {
    lVar5 = 0x60;
    for (lVar4 = 1; lVar4 < this->num_samples; lVar4 = lVar4 + 1) {
      psVar1 = this->t_stats[lVar6];
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&psVar1->latencies,
                 (const_iterator)
                 (psVar1->latencies).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )*(unsigned_long **)((long)psVar1 + lVar5 + -8),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )*(unsigned_long **)((long)&(psVar1->name)._M_dataplus._M_p + lVar5));
      psVar1 = this->t_stats[lVar6];
      lVar2 = *(long *)((long)psVar1 + lVar5 + -8);
      if (*(long *)((long)&(psVar1->name)._M_dataplus._M_p + lVar5) != lVar2) {
        *(long *)((long)&(psVar1->name)._M_dataplus._M_p + lVar5) = lVar2;
      }
      lVar5 = lVar5 + 0x38;
    }
    psVar1 = this->t_stats[lVar6];
    std::__cxx11::string::string((string *)&printed,(string *)psVar1);
    local_38 = &psVar1->latencies;
    std::
    vector<std::pair<std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>*>,std::allocator<std::pair<std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>>
    ::
    emplace_back<std::pair<std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>
              ((vector<std::pair<std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>*>,std::allocator<std::pair<std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>>
                *)&all_timings,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
                *)&printed);
    std::__cxx11::string::~string((string *)&printed);
  }
  printed = 0;
  this_00 = "\n===== Avg Latencies (%s) - %d samples (%s) %n";
  printf("\n===== Avg Latencies (%s) - %d samples (%s) %n",local_b8,(ulong)local_bc,local_b0,
         &printed);
  fillLineWith((StatAggregator *)this_00,'=',0x58 - printed);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ::vector(&local_90,&all_timings);
  this_01 = &local_78;
  std::__cxx11::string::string((string *)this_01,pcVar3,&local_bd);
  printValues((StatAggregator *)this_01,&local_90,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  this_02 = (StatAggregator *)&local_90;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
             *)this_02);
  fillLineWith(this_02,'=',0x57);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ::~vector(&all_timings);
  return;
}

Assistant:

void StatAggregator::aggregateAndPrintStats(const char* title, int count,
                                            const char* unit) {

    samples_t all_timings;
    for (int i = 0; i < num_stats; ++i) {
        for (int j = 1; j < num_samples; ++j) {
            t_stats[i][0].latencies.insert(t_stats[i][0].latencies.end(),
                                           t_stats[i][j].latencies.begin(),
                                           t_stats[i][j].latencies.end());
            t_stats[i][j].latencies.clear();
        }

        all_timings.push_back(std::make_pair(t_stats[i][0].name,
                                             &t_stats[i][0].latencies));
    }

    int printed = 0;
    printf("\n===== Avg Latencies (%s) - %d samples (%s) %n",
            title, count, unit, &printed);
    fillLineWith('=', 88-printed);

    printValues(all_timings, unit);

    fillLineWith('=', 87);
}